

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractnetworkcache.cpp
# Opt level: O0

void __thiscall QNetworkCacheMetaData::setSaveToDisk(QNetworkCacheMetaData *this,bool allow)

{
  byte bVar1;
  QNetworkCacheMetaDataPrivate *pQVar2;
  byte in_SIL;
  undefined6 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  pQVar2 = QSharedDataPointer<QNetworkCacheMetaDataPrivate>::operator->
                     ((QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)
                      (CONCAT17(in_SIL,CONCAT16(in_SIL,in_stack_fffffffffffffff0)) &
                      0x101ffffffffffff));
  pQVar2->saveToDisk = (bool)(bVar1 & 1);
  return;
}

Assistant:

void QNetworkCacheMetaData::setSaveToDisk(bool allow)
{
    d->saveToDisk = allow;
}